

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnSimdShuffleOpExpr
          (BinaryReaderIR *this,Opcode opcode,v128 value)

{
  Result RVar1;
  pointer *__ptr;
  Expr *local_38;
  Opcode local_2c;
  _Head_base<0UL,_wabt::Expr_*,_false> local_28;
  v128 local_20;
  
  local_20.v._8_8_ = value.v._8_8_;
  local_20.v._0_8_ = value.v._0_8_;
  local_2c.enum_ = opcode.enum_;
  MakeUnique<wabt::SimdShuffleOpExpr,wabt::Opcode&,v128&>((wabt *)&local_38,&local_2c,&local_20);
  local_28._M_head_impl = local_38;
  local_38 = (Expr *)0x0;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_28);
  if (local_28._M_head_impl != (Expr *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Expr[1])();
  }
  if (local_38 != (Expr *)0x0) {
    (**(code **)(*(long *)local_38 + 8))();
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnSimdShuffleOpExpr(Opcode opcode, v128 value) {
  return AppendExpr(MakeUnique<SimdShuffleOpExpr>(opcode, value));
}